

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.cpp
# Opt level: O0

bool __thiscall CBinds::CBindsSpecial::OnInput(CBindsSpecial *this,CEvent Event)

{
  uint uVar1;
  IConsole *pIVar2;
  long in_RDI;
  uint in_stack_00000008;
  int in_stack_0000000c;
  int m;
  bool rtn;
  int Mask;
  IInput *in_stack_ffffffffffffffc8;
  int local_1c;
  bool local_15;
  bool local_1;
  
  CComponent::Input((CComponent *)0x147876);
  uVar1 = GetModifierMask(in_stack_ffffffffffffffc8);
  if (((in_stack_0000000c < 0xba) || (0xc5 < in_stack_0000000c)) &&
     ((in_stack_0000000c < 0xe8 || (0xf3 < in_stack_0000000c)))) {
    local_1 = false;
  }
  else {
    local_15 = false;
    for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
      if (((uVar1 & 1 << ((byte)local_1c & 0x1f)) != 0) &&
         (*(char *)(*(long *)(in_RDI + 0x10) + 0x28 + (long)in_stack_0000000c * 0x200 +
                   (long)local_1c * 0x80) != '\0')) {
        if ((in_stack_00000008 & 1) != 0) {
          pIVar2 = GetConsole((CBinds *)0x14794c);
          (*(pIVar2->super_IInterface)._vptr_IInterface[0x15])
                    (pIVar2,1,*(long *)(in_RDI + 0x10) + 0x28 + (long)in_stack_0000000c * 0x200 +
                              (long)local_1c * 0x80);
        }
        if ((in_stack_00000008 & 2) != 0) {
          pIVar2 = GetConsole((CBinds *)0x1479a3);
          (*(pIVar2->super_IInterface)._vptr_IInterface[0x15])
                    (pIVar2,0,*(long *)(in_RDI + 0x10) + 0x28 + (long)in_stack_0000000c * 0x200 +
                              (long)local_1c * 0x80);
        }
        local_15 = true;
      }
    }
    local_1 = local_15;
  }
  return local_1;
}

Assistant:

bool CBinds::CBindsSpecial::OnInput(IInput::CEvent Event)
{
	int Mask = GetModifierMask(Input());

	// don't handle anything but FX and composed FX binds
	if(/*Mask == 1 && */!(Event.m_Key >= KEY_F1 && Event.m_Key <= KEY_F12) && !(Event.m_Key >= KEY_F13 && Event.m_Key <= KEY_F24))
		return false;

	bool rtn = false;
	for(int m = 0; m < MODIFIER_COUNT; m++)
	{
		if((Mask&(1 << m)) && m_pBinds->m_aaaKeyBindings[Event.m_Key][m][0] != 0)
		{
			if(Event.m_Flags&IInput::FLAG_PRESS)
				m_pBinds->GetConsole()->ExecuteLineStroked(1, m_pBinds->m_aaaKeyBindings[Event.m_Key][m]);
			if(Event.m_Flags&IInput::FLAG_RELEASE)
				m_pBinds->GetConsole()->ExecuteLineStroked(0, m_pBinds->m_aaaKeyBindings[Event.m_Key][m]);
			rtn = true;
		}
	}
	return rtn;
}